

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void set_ma_use_armci_mem_(void)

{
  int code;
  int retval;
  char *unaff_retaddr;
  
  code = setenv("MA_USE_ARMCI_MEM","YES",1);
  if (code != 0) {
    GA_Error(unaff_retaddr,code);
  }
  return;
}

Assistant:

void FATR set_ma_use_armci_mem_() 
{
    int retval;
#if defined(_WIN32)
    if((retval=_putenv("MA_USE_ARMCI_MEM=YES")) != 0)
#else
    if((retval=setenv("MA_USE_ARMCI_MEM", "YES", 1)) != 0)
#endif          
    GA_Error("setenv failed: insufficient space in the environment",1);
}